

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a,Integer s_b,Integer trans)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  logical lVar10;
  void *__ptr;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Integer *pIVar15;
  long lVar16;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double _ic_7;
  double _rc_7;
  double _ib_7;
  double _rb_7;
  double _ia_7;
  double _ra_7;
  double _ic_6;
  double _rc_6;
  double _ib_6;
  double _rb_6;
  double _ia_6;
  double _ra_6;
  Integer _ncols_13;
  Integer _ahi_13;
  Integer _alo_13;
  Integer _ld_a_13;
  Integer _kk_13;
  Integer _jj_13;
  Integer _ii_13;
  Integer _k_13;
  Integer _j_13;
  Integer _i_13;
  float _ic_5;
  float _rc_5;
  float _ib_5;
  float _rb_5;
  float _ia_5;
  float _ra_5;
  float _ic_4;
  float _rc_4;
  float _ib_4;
  float _rb_4;
  float _ia_4;
  float _ra_4;
  Integer _ncols_12;
  Integer _ahi_12;
  Integer _alo_12;
  Integer _ld_a_12;
  Integer _kk_12;
  Integer _jj_12;
  Integer _ii_12;
  Integer _k_12;
  Integer _j_12;
  Integer _i_12;
  Integer _ncols_11;
  Integer _ahi_11;
  Integer _alo_11;
  Integer _ld_a_11;
  Integer _kk_11;
  Integer _jj_11;
  Integer _ii_11;
  Integer _k_11;
  Integer _j_11;
  Integer _i_11;
  Integer _ncols_10;
  Integer _ahi_10;
  Integer _alo_10;
  Integer _ld_a_10;
  Integer _kk_10;
  Integer _jj_10;
  Integer _ii_10;
  Integer _k_10;
  Integer _j_10;
  Integer _i_10;
  Integer _ncols_9;
  Integer _ahi_9;
  Integer _alo_9;
  Integer _ld_a_9;
  Integer _kk_9;
  Integer _jj_9;
  Integer _ii_9;
  Integer _k_9;
  Integer _j_9;
  Integer _i_9;
  Integer _ncols_8;
  Integer _ahi_8;
  Integer _alo_8;
  Integer _ld_a_8;
  Integer _kk_8;
  Integer _jj_8;
  Integer _ii_8;
  Integer _k_8;
  Integer _j_8;
  Integer _i_8;
  Integer _ncols_7;
  Integer _ahi_7;
  Integer _alo_7;
  Integer _ld_a_7;
  Integer _kk_7;
  Integer _jj_7;
  Integer _ii_7;
  Integer _k_7;
  Integer _j_7;
  Integer _i_7;
  int64_t *jdx_b_1;
  int64_t *idx_b_1;
  double _ic_3;
  double _rc_3;
  double _ib_3;
  double _rb_3;
  double _ia_3;
  double _ra_3;
  double _ic_2;
  double _rc_2;
  double _ib_2;
  double _rb_2;
  double _ia_2;
  double _ra_2;
  Integer _ncols_6;
  Integer _ahi_6;
  Integer _alo_6;
  Integer _ld_a_6;
  Integer _kk_6;
  Integer _jj_6;
  Integer _ii_6;
  Integer _k_6;
  Integer _j_6;
  Integer _i_6;
  float _ic_1;
  float _rc_1;
  float _ib_1;
  float _rb_1;
  float _ia_1;
  float _ra_1;
  float _ic;
  float _rc;
  float _ib;
  float _rb;
  float _ia;
  float _ra;
  Integer _ncols_5;
  Integer _ahi_5;
  Integer _alo_5;
  Integer _ld_a_5;
  Integer _kk_5;
  Integer _jj_5;
  Integer _ii_5;
  Integer _k_5;
  Integer _j_5;
  Integer _i_5;
  Integer _ncols_4;
  Integer _ahi_4;
  Integer _alo_4;
  Integer _ld_a_4;
  Integer _kk_4;
  Integer _jj_4;
  Integer _ii_4;
  Integer _k_4;
  Integer _j_4;
  Integer _i_4;
  Integer _ncols_3;
  Integer _ahi_3;
  Integer _alo_3;
  Integer _ld_a_3;
  Integer _kk_3;
  Integer _jj_3;
  Integer _ii_3;
  Integer _k_3;
  Integer _j_3;
  Integer _i_3;
  Integer _ncols_2;
  Integer _ahi_2;
  Integer _alo_2;
  Integer _ld_a_2;
  Integer _kk_2;
  Integer _jj_2;
  Integer _ii_2;
  Integer _k_2;
  Integer _j_2;
  Integer _i_2;
  Integer _ncols_1;
  Integer _ahi_1;
  Integer _alo_1;
  Integer _ld_a_1;
  Integer _kk_1;
  Integer _jj_1;
  Integer _ii_1;
  Integer _k_1;
  Integer _j_1;
  Integer _i_1;
  Integer _ncols;
  Integer _ahi;
  Integer _alo;
  Integer _ld_a;
  Integer _kk;
  Integer _jj;
  Integer _ii;
  Integer _k;
  Integer _j;
  Integer _i;
  int *jdx_b;
  int *idx_b;
  Integer jlen;
  Integer ii;
  Integer nelem;
  void *val_b;
  void *buf_a;
  Integer jhi_b;
  Integer jlo_b;
  Integer ihi_b;
  Integer ilo_b;
  Integer thi_a [2];
  Integer tlo_a [2];
  Integer ld_a [2];
  Integer hi_a [2];
  Integer lo_a [2];
  void *jptr_b;
  void *iptr_b;
  Integer thi_c [2];
  Integer tlo_c [2];
  Integer ld_c [2];
  Integer hi_c [2];
  Integer lo_c [2];
  void *jptr;
  void *iptr;
  void *data_b;
  void *data_a;
  void *data_c;
  Integer *size;
  Integer *map;
  int64_t max_nnz;
  Integer *row_nnz;
  Integer max_nnz_b;
  Integer max_nnz_a;
  Integer ilen;
  Integer two;
  Integer g_c;
  Integer nblocks;
  Integer *count;
  Integer rowdim;
  Integer blocks [2];
  Integer gdims [2];
  Integer jlo;
  Integer jhi;
  Integer ilo;
  Integer ihi;
  Integer type;
  Integer longidx;
  Integer me;
  Integer nprocs;
  Integer nn;
  Integer n;
  Integer m;
  Integer l;
  Integer k;
  Integer j;
  Integer i;
  Integer jdim;
  Integer idim;
  Integer elemsize;
  int local_sync_end;
  int local_sync_begin;
  Integer hdl_c;
  Integer hdl_b;
  Integer hdl_a;
  Integer icnt;
  Integer lcnt;
  Integer in_stack_fffffffffffff7a8;
  long *in_stack_fffffffffffff7b0;
  Integer in_stack_fffffffffffff7b8;
  Integer *in_stack_fffffffffffff7c0;
  Integer *in_stack_fffffffffffff7c8;
  Integer *in_stack_fffffffffffff7d0;
  Integer *in_stack_fffffffffffff7d8;
  double in_stack_fffffffffffff7e0;
  long local_7c8;
  Integer *local_7c0;
  long local_7b8;
  Integer *local_798;
  long local_790;
  Integer *local_788;
  void **in_stack_fffffffffffff880;
  float in_stack_fffffffffffff888;
  float in_stack_fffffffffffff88c;
  float in_stack_fffffffffffff890;
  float in_stack_fffffffffffff894;
  Integer in_stack_fffffffffffff898;
  float in_stack_fffffffffffff8a0;
  float in_stack_fffffffffffff8a4;
  float in_stack_fffffffffffff8a8;
  float in_stack_fffffffffffff8ac;
  long local_748;
  Integer *in_stack_fffffffffffff8c0;
  Integer *in_stack_fffffffffffff8c8;
  Integer *in_stack_fffffffffffff8d0;
  Integer *in_stack_fffffffffffff8d8;
  Integer *local_718;
  long local_710;
  Integer *local_708;
  long local_6f8;
  Integer *local_6f0;
  long local_6e8;
  Integer *local_6c8;
  long local_6c0;
  Integer in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  long local_6a8;
  Integer *in_stack_fffffffffffff960;
  void *in_stack_fffffffffffff968;
  Integer *in_stack_fffffffffffff970;
  Integer *in_stack_fffffffffffff978;
  long in_stack_fffffffffffff980;
  Integer *local_678;
  long local_670;
  Integer *local_668;
  long local_658;
  Integer *local_650;
  long local_648;
  Integer *local_628;
  long local_620;
  Integer *local_618;
  long local_608;
  Integer *local_600;
  long local_5f8;
  Integer *local_5d8;
  long local_5d0;
  Integer *local_5c8;
  long local_5b8;
  Integer *local_5b0;
  long local_5a8;
  Integer *local_588;
  long local_580;
  Integer *local_578;
  long local_4f8;
  Integer *local_4f0;
  long local_4e8;
  Integer *local_4c8;
  long local_4c0;
  Integer *local_4b8;
  long local_478;
  Integer *in_stack_fffffffffffffb90;
  void *in_stack_fffffffffffffb98;
  Integer *in_stack_fffffffffffffba0;
  Integer *in_stack_fffffffffffffba8;
  long in_stack_fffffffffffffbb0;
  Integer *local_448;
  long local_440;
  Integer *local_438;
  long local_428;
  Integer *local_420;
  long local_418;
  Integer *local_3f8;
  long local_3f0;
  Integer *local_3e8;
  long local_3d8;
  Integer *local_3d0;
  long local_3c8;
  Integer *local_3a8;
  long local_3a0;
  Integer *local_398;
  long local_388;
  Integer *local_380;
  long local_378;
  Integer *local_358;
  long local_350;
  Integer *local_348;
  long local_338;
  Integer *local_330;
  long local_328;
  Integer *local_308;
  long local_300;
  Integer *local_2f8;
  Integer in_stack_fffffffffffffd10;
  long local_2e8;
  Integer *local_2e0;
  long local_2d8;
  Integer *local_2b8;
  long local_2b0;
  Integer *local_2a8;
  long local_278;
  long local_260;
  long local_258;
  Integer *local_250;
  long local_248;
  long local_240;
  Integer *local_238;
  Integer *local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  Integer *local_208;
  Integer *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  Integer *local_1d8;
  Integer *local_1d0;
  Integer local_1c8;
  Integer local_1c0;
  long local_1b8;
  long local_1b0;
  Integer *local_1a8;
  Integer *local_1a0;
  long local_170;
  void *local_168;
  undefined8 *local_160;
  undefined8 local_130;
  Integer local_128;
  long local_108;
  long local_100;
  Integer local_f8;
  Integer local_f0;
  Integer *local_d0;
  long local_c8;
  Integer local_c0;
  ulong local_b8;
  Integer local_b0;
  Integer local_a8;
  long local_98;
  long local_88;
  long local_70;
  Integer local_68;
  Integer local_60;
  Integer local_58;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  long local_38;
  long local_20;
  
  local_38 = in_RDI + 1000;
  local_40 = in_RSI + 1000;
  local_20 = in_RDX;
  local_a8 = pnga_pgroup_nnodes(SPA[local_40].grp);
  local_b0 = pnga_pgroup_nodeid(SPA[local_40].grp);
  iVar9 = _ga_sync_begin;
  local_130 = 2;
  local_4c = _ga_sync_begin;
  local_50 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar9 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffff7b0);
  }
  if ((long)GA[local_38].type != SPA[local_40].type) {
    pnga_error(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  local_c0 = SPA[local_40].type;
  if ((long)GA[local_38].p_handle != SPA[local_40].grp) {
    pnga_error(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  if (GA[local_38].ndim != 2) {
    pnga_error(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  if (((local_20 != 0) && (GA[local_38].dims[0] != SPA[local_40].jdim)) ||
     ((local_20 == 0 && (GA[local_38].dims[1] != SPA[local_40].jdim)))) {
    pnga_error(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  local_b8 = (ulong)(SPA[local_40].idx_size == 8);
  local_58 = SPA[local_40].size;
  if (local_20 == 0) {
    local_60 = GA[local_38].dims[0];
  }
  else {
    local_60 = GA[local_38].dims[1];
  }
  local_68 = SPA[local_40].jdim;
  local_128 = pnga_create_handle();
  local_48 = local_128 + 1000;
  if (local_20 == 0) {
    local_f8 = local_60;
    local_f0 = local_68;
  }
  else {
    local_f8 = local_68;
    local_f0 = local_60;
  }
  pnga_set_data((Integer)in_stack_fffffffffffff7d0,(Integer)in_stack_fffffffffffff7c8,
                in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  local_160 = (undefined8 *)malloc((local_a8 + 1) * 8);
  local_168 = malloc(local_a8 << 3);
  for (local_d0 = (Integer *)((local_60 * local_b0) / local_a8);
      ((long)local_d0 * local_a8) / local_60 < local_b0; local_d0 = (Integer *)((long)local_d0 + 1))
  {
  }
  for (; local_b0 < ((long)local_d0 * local_a8) / local_60;
      local_d0 = (Integer *)((long)local_d0 + -1)) {
  }
  if (((long)local_d0 * local_a8) / local_60 != local_b0) {
    local_d0 = (Integer *)((long)local_d0 + 1);
  }
  local_d0 = (Integer *)((long)local_d0 + 1);
  local_c8 = local_60;
  if (local_b0 < local_a8 + -1) {
    for (local_c8 = (local_60 * (local_b0 + 1)) / local_a8;
        (local_c8 * local_a8) / local_60 < local_b0 + 1; local_c8 = local_c8 + 1) {
    }
    for (; local_b0 + 1 < (local_c8 * local_a8) / local_60; local_c8 = local_c8 + -1) {
    }
  }
  for (local_70 = 0; local_70 < local_a8; local_70 = local_70 + 1) {
    *(undefined8 *)((long)local_168 + local_70 * 8) = 0;
  }
  *(long *)((long)local_168 + local_b0 * 8) = (local_c8 - (long)local_d0) + 1;
  pnga_pgroup_gop((Integer)in_stack_fffffffffffff7d0,(Integer)in_stack_fffffffffffff7c8,
                  in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                  (char *)in_stack_fffffffffffff7b0);
  if (local_20 == 0) {
    *local_160 = 1;
    for (local_70 = 1; local_70 < local_a8; local_70 = local_70 + 1) {
      local_160[local_70] =
           local_160[local_70 + -1] + *(long *)((long)local_168 + (local_70 + -1) * 8);
    }
    local_160[local_a8] = 1;
    local_108 = local_a8;
    local_100 = 1;
  }
  else {
    *local_160 = 1;
    local_160[1] = 1;
    for (local_70 = 1; local_70 < local_a8; local_70 = local_70 + 1) {
      local_160[local_70 + 1] =
           local_160[local_70] + *(long *)((long)local_168 + (local_70 + -1) * 8);
    }
    local_108 = 1;
    local_100 = local_a8;
  }
  pnga_set_irreg_distr
            ((Integer)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0)
  ;
  pnga_set_pgroup((Integer)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  lVar10 = pnga_allocate(in_stack_fffffffffffffd10);
  if (lVar10 == 0) {
    pnga_error(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  pnga_zero((Integer)in_stack_fffffffffffff8d0);
  for (local_88 = 0; local_88 < local_a8; local_88 = local_88 + 1) {
    local_1a8 = local_d0;
    local_1b8 = local_c8;
    pnga_sprs_array_row_distribution
              ((Integer)in_stack_fffffffffffff7e0,(Integer)in_stack_fffffffffffff7d8,
               in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    local_1a0 = (Integer *)((long)local_1a0 + 1);
    local_1b0 = local_1b0 + 1;
    if (local_20 == 0) {
      local_1d8 = local_1a8;
      local_1e8 = local_1b8;
      local_1e0 = local_1b0;
      local_1d0 = local_1a0;
    }
    else {
      local_1d0 = local_1a8;
      local_1e0 = local_1b8;
      local_1e8 = local_1b0;
      local_1d8 = local_1a0;
    }
    for (local_98 = 0; local_98 < local_a8; local_98 = local_98 + 1) {
      if (local_20 == 0) {
        local_1c8 = (local_1e8 - (long)local_1d8) + 1;
        local_1c0 = local_68;
      }
      else {
        local_1c8 = local_68;
        local_1c0 = (local_1e0 - (long)local_1d0) + 1;
      }
      pnga_access_ptr(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                      in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      in_stack_fffffffffffff7b0 = &local_258;
      lVar10 = pnga_sprs_array_get_block
                         (CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                          CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                          in_stack_fffffffffffff898,
                          (void **)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          (void **)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                          in_stack_fffffffffffff880,in_stack_fffffffffffff8c0,
                          in_stack_fffffffffffff8c8,in_stack_fffffffffffff8d0,
                          in_stack_fffffffffffff8d8);
      if (lVar10 != 0) {
        local_208 = local_1a8;
        local_218 = local_1b8;
        local_200 = local_250;
        local_210 = local_258;
        if (local_20 == 0) {
          local_238 = local_1a8;
          local_248 = local_1b8;
          local_230 = local_250;
          local_240 = local_258;
        }
        else {
          local_238 = local_250;
          local_248 = local_258;
          local_230 = local_1a8;
          local_240 = local_1b8;
        }
        __ptr = malloc(((local_248 - (long)local_238) + 1) * ((local_240 - (long)local_230) + 1) *
                       SPA[local_40].size);
        local_228 = (local_248 - (long)local_238) + 1;
        local_220 = (local_240 - (long)local_230) + 1;
        pnga_get(in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 in_stack_fffffffffffff968,in_stack_fffffffffffff960);
        if (SPA[local_40].idx_size == 4) {
          if (local_c0 == 0x3e9) {
            if (local_20 == 0) {
              local_2e0 = local_238;
              local_2e8 = local_248;
            }
            else {
              local_2e0 = local_230;
              local_2e8 = local_240;
            }
            local_2d8 = (local_248 - (long)local_238) + 1;
            for (local_2a8 = local_2e0; (long)local_2a8 <= local_2e8;
                local_2a8 = (Integer *)((long)local_2a8 + 1)) {
              lVar11 = (long)local_2a8 - (long)local_2e0;
              for (local_2b8 = local_250; (long)local_2b8 <= local_258;
                  local_2b8 = (Integer *)((long)local_2b8 + 1)) {
                lVar12 = (long)local_2b8 - (long)local_250;
                lVar13 = (long)(*(int *)(local_1f0 + 4 + lVar12 * 4) -
                               *(int *)(local_1f0 + lVar12 * 4));
                if (local_20 == 0) {
                  for (local_2b0 = 0; local_2b0 < lVar13; local_2b0 = local_2b0 + 1) {
                    lVar14 = ((*(int *)(local_1f8 +
                                       (*(int *)(local_1f0 + lVar12 * 4) + local_2b0) * 4) -
                              local_260) + 1) * local_1c8 + lVar11;
                    *(int *)(local_170 + lVar14 * 4) =
                         *(int *)((long)__ptr + (lVar11 + lVar12 * local_2d8) * 4) *
                         *(int *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_2b0) * 4) +
                         *(int *)(local_170 + lVar14 * 4);
                  }
                }
                else {
                  for (local_2b0 = 0; local_2b0 < lVar13; local_2b0 = local_2b0 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_2b0) * 4) -
                             local_260) + 1 + lVar11 * local_1c8;
                    *(int *)(local_170 + lVar14 * 4) =
                         *(int *)((long)__ptr + (lVar11 * local_2d8 + lVar12) * 4) *
                         *(int *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_2b0) * 4) +
                         *(int *)(local_170 + lVar14 * 4);
                  }
                }
              }
            }
          }
          else if (local_c0 == 0x3ea) {
            if (local_20 == 0) {
              local_330 = local_238;
              local_338 = local_248;
            }
            else {
              local_330 = local_230;
              local_338 = local_240;
            }
            local_328 = (local_248 - (long)local_238) + 1;
            for (local_2f8 = local_330; (long)local_2f8 <= local_338;
                local_2f8 = (Integer *)((long)local_2f8 + 1)) {
              lVar11 = (long)local_2f8 - (long)local_330;
              for (local_308 = local_250; (long)local_308 <= local_258;
                  local_308 = (Integer *)((long)local_308 + 1)) {
                lVar12 = (long)local_308 - (long)local_250;
                lVar13 = (long)(*(int *)(local_1f0 + 4 + lVar12 * 4) -
                               *(int *)(local_1f0 + lVar12 * 4));
                if (local_20 == 0) {
                  for (local_300 = 0; local_300 < lVar13; local_300 = local_300 + 1) {
                    lVar14 = ((*(int *)(local_1f8 +
                                       (*(int *)(local_1f0 + lVar12 * 4) + local_300) * 4) -
                              local_260) + 1) * local_1c8 + lVar11;
                    *(long *)(local_170 + lVar14 * 8) =
                         *(long *)((long)__ptr + (lVar11 + lVar12 * local_328) * 8) *
                         *(long *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_300) * 8) +
                         *(long *)(local_170 + lVar14 * 8);
                  }
                }
                else {
                  for (local_300 = 0; local_300 < lVar13; local_300 = local_300 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_300) * 4) -
                             local_260) + 1 + lVar11 * local_1c8;
                    *(long *)(local_170 + lVar14 * 8) =
                         *(long *)((long)__ptr + (lVar11 * local_328 + lVar12) * 8) *
                         *(long *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_300) * 8) +
                         *(long *)(local_170 + lVar14 * 8);
                  }
                }
              }
            }
          }
          else if (local_c0 == 0x3f8) {
            if (local_20 == 0) {
              local_380 = local_238;
              local_388 = local_248;
            }
            else {
              local_380 = local_230;
              local_388 = local_240;
            }
            local_378 = (local_248 - (long)local_238) + 1;
            for (local_348 = local_380; (long)local_348 <= local_388;
                local_348 = (Integer *)((long)local_348 + 1)) {
              lVar11 = (long)local_348 - (long)local_380;
              for (local_358 = local_250; (long)local_358 <= local_258;
                  local_358 = (Integer *)((long)local_358 + 1)) {
                lVar12 = (long)local_358 - (long)local_250;
                lVar13 = (long)(*(int *)(local_1f0 + 4 + lVar12 * 4) -
                               *(int *)(local_1f0 + lVar12 * 4));
                if (local_20 == 0) {
                  for (local_350 = 0; local_350 < lVar13; local_350 = local_350 + 1) {
                    lVar14 = ((*(int *)(local_1f8 +
                                       (*(int *)(local_1f0 + lVar12 * 4) + local_350) * 4) -
                              local_260) + 1) * local_1c8 + lVar11;
                    *(long *)(local_170 + lVar14 * 8) =
                         *(long *)((long)__ptr + (lVar11 + lVar12 * local_378) * 8) *
                         *(long *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_350) * 8) +
                         *(long *)(local_170 + lVar14 * 8);
                  }
                }
                else {
                  for (local_350 = 0; local_350 < lVar13; local_350 = local_350 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_350) * 4) -
                             local_260) + 1 + lVar11 * local_1c8;
                    *(long *)(local_170 + lVar14 * 8) =
                         *(long *)((long)__ptr + (lVar11 * local_378 + lVar12) * 8) *
                         *(long *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_350) * 8) +
                         *(long *)(local_170 + lVar14 * 8);
                  }
                }
              }
            }
          }
          else if (local_c0 == 0x3eb) {
            if (local_20 == 0) {
              local_3d0 = local_238;
              local_3d8 = local_248;
            }
            else {
              local_3d0 = local_230;
              local_3d8 = local_240;
            }
            local_3c8 = (local_248 - (long)local_238) + 1;
            for (local_398 = local_3d0; (long)local_398 <= local_3d8;
                local_398 = (Integer *)((long)local_398 + 1)) {
              lVar11 = (long)local_398 - (long)local_3d0;
              for (local_3a8 = local_250; (long)local_3a8 <= local_258;
                  local_3a8 = (Integer *)((long)local_3a8 + 1)) {
                lVar12 = (long)local_3a8 - (long)local_250;
                lVar13 = (long)(*(int *)(local_1f0 + 4 + lVar12 * 4) -
                               *(int *)(local_1f0 + lVar12 * 4));
                if (local_20 == 0) {
                  for (local_3a0 = 0; local_3a0 < lVar13; local_3a0 = local_3a0 + 1) {
                    lVar14 = ((*(int *)(local_1f8 +
                                       (*(int *)(local_1f0 + lVar12 * 4) + local_3a0) * 4) -
                              local_260) + 1) * local_1c8 + lVar11;
                    *(float *)(local_170 + lVar14 * 4) =
                         *(float *)((long)__ptr + (lVar11 + lVar12 * local_3c8) * 4) *
                         *(float *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_3a0) * 4)
                         + *(float *)(local_170 + lVar14 * 4);
                  }
                }
                else {
                  for (local_3a0 = 0; local_3a0 < lVar13; local_3a0 = local_3a0 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_3a0) * 4) -
                             local_260) + 1 + lVar11 * local_1c8;
                    *(float *)(local_170 + lVar14 * 4) =
                         *(float *)((long)__ptr + (lVar11 * local_3c8 + lVar12) * 4) *
                         *(float *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_3a0) * 4)
                         + *(float *)(local_170 + lVar14 * 4);
                  }
                }
              }
            }
          }
          else if (local_c0 == 0x3ec) {
            if (local_20 == 0) {
              local_420 = local_238;
              local_428 = local_248;
            }
            else {
              local_420 = local_230;
              local_428 = local_240;
            }
            local_418 = (local_248 - (long)local_238) + 1;
            for (local_3e8 = local_420; (long)local_3e8 <= local_428;
                local_3e8 = (Integer *)((long)local_3e8 + 1)) {
              lVar11 = (long)local_3e8 - (long)local_420;
              for (local_3f8 = local_250; (long)local_3f8 <= local_258;
                  local_3f8 = (Integer *)((long)local_3f8 + 1)) {
                lVar12 = (long)local_3f8 - (long)local_250;
                lVar13 = (long)(*(int *)(local_1f0 + 4 + lVar12 * 4) -
                               *(int *)(local_1f0 + lVar12 * 4));
                if (local_20 == 0) {
                  for (local_3f0 = 0; local_3f0 < lVar13; local_3f0 = local_3f0 + 1) {
                    lVar14 = ((*(int *)(local_1f8 +
                                       (*(int *)(local_1f0 + lVar12 * 4) + local_3f0) * 4) -
                              local_260) + 1) * local_1c8 + lVar11;
                    *(double *)(local_170 + lVar14 * 8) =
                         *(double *)((long)__ptr + (lVar11 + lVar12 * local_418) * 8) *
                         *(double *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_3f0) * 8)
                         + *(double *)(local_170 + lVar14 * 8);
                  }
                }
                else {
                  for (local_3f0 = 0; local_3f0 < lVar13; local_3f0 = local_3f0 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_3f0) * 4) -
                             local_260) + 1 + lVar11 * local_1c8;
                    *(double *)(local_170 + lVar14 * 8) =
                         *(double *)((long)__ptr + (lVar11 * local_418 + lVar12) * 8) *
                         *(double *)(local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_3f0) * 8)
                         + *(double *)(local_170 + lVar14 * 8);
                  }
                }
              }
            }
          }
          else if (local_c0 == 0x3ee) {
            if (local_20 == 0) {
              local_478 = local_248;
              in_stack_fffffffffffffb90 = local_238;
            }
            else {
              local_478 = local_240;
              in_stack_fffffffffffffb90 = local_230;
            }
            in_stack_fffffffffffffb98 = (void *)((local_248 - (long)local_238) + 1);
            for (local_438 = in_stack_fffffffffffffb90; (long)local_438 <= local_478;
                local_438 = (Integer *)((long)local_438 + 1)) {
              in_stack_fffffffffffffbb0 = (long)local_438 - (long)in_stack_fffffffffffffb90;
              for (local_448 = local_250; (long)local_448 <= local_258;
                  local_448 = (Integer *)((long)local_448 + 1)) {
                in_stack_fffffffffffffba0 = (Integer *)((long)local_448 - (long)local_250);
                lVar11 = (long)(*(int *)(local_1f0 + 4 + (long)in_stack_fffffffffffffba0 * 4) -
                               *(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4));
                if (local_20 == 0) {
                  for (local_440 = 0; local_440 < lVar11; local_440 = local_440 + 1) {
                    in_stack_fffffffffffffba8 =
                         (Integer *)
                         ((*(int *)(local_1f8 +
                                   (*(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4) +
                                   local_440) * 4) - local_260) + 1);
                    fVar1 = *(float *)((long)__ptr +
                                      (in_stack_fffffffffffffbb0 +
                                      (long)in_stack_fffffffffffffba0 *
                                      (long)in_stack_fffffffffffffb98) * 8);
                    fVar2 = *(float *)((long)__ptr +
                                      in_stack_fffffffffffffbb0 * (long)in_stack_fffffffffffffba0 *
                                      (long)in_stack_fffffffffffffb98 * 8 + 4);
                    fVar3 = *(float *)(local_278 +
                                      (*(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4) +
                                      local_440) * 8);
                    fVar4 = *(float *)(local_278 + 4 +
                                      (*(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4) +
                                      local_440) * 8);
                    lVar12 = (long)in_stack_fffffffffffffba8 * local_1c8 + in_stack_fffffffffffffbb0
                    ;
                    *(float *)(local_170 + lVar12 * 8) =
                         fVar1 * fVar3 + -(fVar2 * fVar4) + *(float *)(local_170 + lVar12 * 8);
                    lVar12 = (long)in_stack_fffffffffffffba8 * local_1c8 + in_stack_fffffffffffffbb0
                    ;
                    *(float *)(local_170 + 4 + lVar12 * 8) =
                         fVar2 * fVar3 + fVar1 * fVar4 + *(float *)(local_170 + 4 + lVar12 * 8);
                  }
                }
                else {
                  for (local_440 = 0; local_440 < lVar11; local_440 = local_440 + 1) {
                    in_stack_fffffffffffffba8 =
                         (Integer *)
                         ((*(int *)(local_1f8 +
                                   (*(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4) +
                                   local_440) * 4) - local_260) + 1);
                    fVar1 = *(float *)((long)__ptr +
                                      (long)(in_stack_fffffffffffffbb0 *
                                             (long)in_stack_fffffffffffffb98 +
                                            (long)in_stack_fffffffffffffba0) * 8);
                    fVar2 = *(float *)((long)__ptr +
                                      (long)(in_stack_fffffffffffffbb0 *
                                             (long)in_stack_fffffffffffffb98 +
                                            (long)in_stack_fffffffffffffba0) * 8 + 4);
                    fVar3 = *(float *)(local_278 +
                                      (*(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4) +
                                      local_440) * 8);
                    fVar4 = *(float *)(local_278 + 4 +
                                      (*(int *)(local_1f0 + (long)in_stack_fffffffffffffba0 * 4) +
                                      local_440) * 8);
                    pIVar15 = (Integer *)
                              ((long)in_stack_fffffffffffffba8 +
                              in_stack_fffffffffffffbb0 * local_1c8);
                    *(float *)(local_170 + (long)pIVar15 * 8) =
                         fVar1 * fVar3 + -(fVar2 * fVar4) +
                         *(float *)(local_170 + (long)pIVar15 * 8);
                    pIVar15 = (Integer *)
                              ((long)in_stack_fffffffffffffba8 +
                              in_stack_fffffffffffffbb0 * local_1c8);
                    *(float *)(local_170 + 4 + (long)pIVar15 * 8) =
                         fVar2 * fVar3 + fVar1 * fVar4 +
                         *(float *)(local_170 + 4 + (long)pIVar15 * 8);
                  }
                }
              }
            }
          }
          else if (local_c0 == 0x3ef) {
            if (local_20 == 0) {
              local_4f0 = local_238;
              local_4f8 = local_248;
            }
            else {
              local_4f0 = local_230;
              local_4f8 = local_240;
            }
            local_4e8 = (local_248 - (long)local_238) + 1;
            for (local_4b8 = local_4f0; (long)local_4b8 <= local_4f8;
                local_4b8 = (Integer *)((long)local_4b8 + 1)) {
              lVar11 = (long)local_4b8 - (long)local_4f0;
              for (local_4c8 = local_250; (long)local_4c8 <= local_258;
                  local_4c8 = (Integer *)((long)local_4c8 + 1)) {
                lVar12 = (long)local_4c8 - (long)local_250;
                lVar13 = (long)(*(int *)(local_1f0 + 4 + lVar12 * 4) -
                               *(int *)(local_1f0 + lVar12 * 4));
                if (local_20 == 0) {
                  for (local_4c0 = 0; local_4c0 < lVar13; local_4c0 = local_4c0 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_4c0) * 4) -
                             local_260) + 1;
                    dVar5 = *(double *)((long)__ptr + (lVar11 + lVar12 * local_4e8) * 0x10);
                    dVar6 = *(double *)((long)__ptr + lVar11 * lVar12 * local_4e8 * 0x10 + 8);
                    dVar7 = *(double *)
                             (local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_4c0) * 0x10);
                    dVar8 = *(double *)
                             (local_278 + 8 + (*(int *)(local_1f0 + lVar12 * 4) + local_4c0) * 0x10)
                    ;
                    lVar16 = lVar14 * local_1c8 + lVar11;
                    *(double *)(local_170 + lVar16 * 0x10) =
                         dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_170 + lVar16 * 0x10);
                    lVar14 = lVar14 * local_1c8 + lVar11;
                    *(double *)(local_170 + 8 + lVar14 * 0x10) =
                         dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_170 + 8 + lVar14 * 0x10);
                  }
                }
                else {
                  for (local_4c0 = 0; local_4c0 < lVar13; local_4c0 = local_4c0 + 1) {
                    lVar14 = (*(int *)(local_1f8 +
                                      (*(int *)(local_1f0 + lVar12 * 4) + local_4c0) * 4) -
                             local_260) + 1;
                    dVar5 = *(double *)((long)__ptr + (lVar11 * local_4e8 + lVar12) * 0x10);
                    dVar6 = *(double *)((long)__ptr + (lVar11 * local_4e8 + lVar12) * 0x10 + 8);
                    dVar7 = *(double *)
                             (local_278 + (*(int *)(local_1f0 + lVar12 * 4) + local_4c0) * 0x10);
                    dVar8 = *(double *)
                             (local_278 + 8 + (*(int *)(local_1f0 + lVar12 * 4) + local_4c0) * 0x10)
                    ;
                    lVar16 = lVar14 + lVar11 * local_1c8;
                    *(double *)(local_170 + lVar16 * 0x10) =
                         dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_170 + lVar16 * 0x10);
                    lVar14 = lVar14 + lVar11 * local_1c8;
                    *(double *)(local_170 + 8 + lVar14 * 0x10) =
                         dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_170 + 8 + lVar14 * 0x10);
                  }
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3e9) {
          if (local_20 == 0) {
            local_5b0 = local_238;
            local_5b8 = local_248;
          }
          else {
            local_5b0 = local_230;
            local_5b8 = local_240;
          }
          local_5a8 = (local_248 - (long)local_238) + 1;
          for (local_578 = local_5b0; (long)local_578 <= local_5b8;
              local_578 = (Integer *)((long)local_578 + 1)) {
            lVar11 = (long)local_578 - (long)local_5b0;
            for (local_588 = local_250; (long)local_588 <= local_258;
                local_588 = (Integer *)((long)local_588 + 1)) {
              lVar12 = (long)local_588 - (long)local_250;
              lVar13 = *(long *)(local_1f0 + 8 + lVar12 * 8) - *(long *)(local_1f0 + lVar12 * 8);
              if (local_20 == 0) {
                for (local_580 = 0; local_580 < lVar13; local_580 = local_580 + 1) {
                  lVar14 = ((*(long *)(local_1f8 +
                                      (*(long *)(local_1f0 + lVar12 * 8) + local_580) * 8) -
                            local_260) + 1) * local_1c8 + lVar11;
                  *(int *)(local_170 + lVar14 * 4) =
                       *(int *)((long)__ptr + (lVar11 + lVar12 * local_5a8) * 4) *
                       *(int *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_580) * 4) +
                       *(int *)(local_170 + lVar14 * 4);
                }
              }
              else {
                for (local_580 = 0; local_580 < lVar13; local_580 = local_580 + 1) {
                  lVar14 = (*(long *)(local_1f8 +
                                     (*(long *)(local_1f0 + lVar12 * 8) + local_580) * 8) -
                           local_260) + 1 + lVar11 * local_1c8;
                  *(int *)(local_170 + lVar14 * 4) =
                       *(int *)((long)__ptr + (lVar11 * local_5a8 + lVar12) * 4) *
                       *(int *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_580) * 4) +
                       *(int *)(local_170 + lVar14 * 4);
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3ea) {
          if (local_20 == 0) {
            local_600 = local_238;
            local_608 = local_248;
          }
          else {
            local_600 = local_230;
            local_608 = local_240;
          }
          local_5f8 = (local_248 - (long)local_238) + 1;
          for (local_5c8 = local_600; (long)local_5c8 <= local_608;
              local_5c8 = (Integer *)((long)local_5c8 + 1)) {
            lVar11 = (long)local_5c8 - (long)local_600;
            for (local_5d8 = local_250; (long)local_5d8 <= local_258;
                local_5d8 = (Integer *)((long)local_5d8 + 1)) {
              lVar12 = (long)local_5d8 - (long)local_250;
              lVar13 = *(long *)(local_1f0 + 8 + lVar12 * 8) - *(long *)(local_1f0 + lVar12 * 8);
              if (local_20 == 0) {
                for (local_5d0 = 0; local_5d0 < lVar13; local_5d0 = local_5d0 + 1) {
                  lVar14 = ((*(long *)(local_1f8 +
                                      (*(long *)(local_1f0 + lVar12 * 8) + local_5d0) * 8) -
                            local_260) + 1) * local_1c8 + lVar11;
                  *(long *)(local_170 + lVar14 * 8) =
                       *(long *)((long)__ptr + (lVar11 + lVar12 * local_5f8) * 8) *
                       *(long *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_5d0) * 8) +
                       *(long *)(local_170 + lVar14 * 8);
                }
              }
              else {
                for (local_5d0 = 0; local_5d0 < lVar13; local_5d0 = local_5d0 + 1) {
                  lVar14 = (*(long *)(local_1f8 +
                                     (*(long *)(local_1f0 + lVar12 * 8) + local_5d0) * 8) -
                           local_260) + 1 + lVar11 * local_1c8;
                  *(long *)(local_170 + lVar14 * 8) =
                       *(long *)((long)__ptr + (lVar11 * local_5f8 + lVar12) * 8) *
                       *(long *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_5d0) * 8) +
                       *(long *)(local_170 + lVar14 * 8);
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3f8) {
          if (local_20 == 0) {
            local_650 = local_238;
            local_658 = local_248;
          }
          else {
            local_650 = local_230;
            local_658 = local_240;
          }
          local_648 = (local_248 - (long)local_238) + 1;
          for (local_618 = local_650; (long)local_618 <= local_658;
              local_618 = (Integer *)((long)local_618 + 1)) {
            lVar11 = (long)local_618 - (long)local_650;
            for (local_628 = local_250; (long)local_628 <= local_258;
                local_628 = (Integer *)((long)local_628 + 1)) {
              lVar12 = (long)local_628 - (long)local_250;
              lVar13 = *(long *)(local_1f0 + 8 + lVar12 * 8) - *(long *)(local_1f0 + lVar12 * 8);
              if (local_20 == 0) {
                for (local_620 = 0; local_620 < lVar13; local_620 = local_620 + 1) {
                  lVar14 = ((*(long *)(local_1f8 +
                                      (*(long *)(local_1f0 + lVar12 * 8) + local_620) * 8) -
                            local_260) + 1) * local_1c8 + lVar11;
                  *(long *)(local_170 + lVar14 * 8) =
                       *(long *)((long)__ptr + (lVar11 + lVar12 * local_648) * 8) *
                       *(long *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_620) * 8) +
                       *(long *)(local_170 + lVar14 * 8);
                }
              }
              else {
                for (local_620 = 0; local_620 < lVar13; local_620 = local_620 + 1) {
                  lVar14 = (*(long *)(local_1f8 +
                                     (*(long *)(local_1f0 + lVar12 * 8) + local_620) * 8) -
                           local_260) + 1 + lVar11 * local_1c8;
                  *(long *)(local_170 + lVar14 * 8) =
                       *(long *)((long)__ptr + (lVar11 * local_648 + lVar12) * 8) *
                       *(long *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_620) * 8) +
                       *(long *)(local_170 + lVar14 * 8);
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3eb) {
          if (local_20 == 0) {
            local_6a8 = local_248;
            in_stack_fffffffffffff960 = local_238;
          }
          else {
            local_6a8 = local_240;
            in_stack_fffffffffffff960 = local_230;
          }
          in_stack_fffffffffffff968 = (void *)((local_248 - (long)local_238) + 1);
          for (local_668 = in_stack_fffffffffffff960; (long)local_668 <= local_6a8;
              local_668 = (Integer *)((long)local_668 + 1)) {
            in_stack_fffffffffffff980 = (long)local_668 - (long)in_stack_fffffffffffff960;
            for (local_678 = local_250; (long)local_678 <= local_258;
                local_678 = (Integer *)((long)local_678 + 1)) {
              in_stack_fffffffffffff970 = (Integer *)((long)local_678 - (long)local_250);
              lVar11 = *(long *)(local_1f0 + 8 + (long)in_stack_fffffffffffff970 * 8) -
                       *(long *)(local_1f0 + (long)in_stack_fffffffffffff970 * 8);
              if (local_20 == 0) {
                for (local_670 = 0; local_670 < lVar11; local_670 = local_670 + 1) {
                  in_stack_fffffffffffff978 =
                       (Integer *)
                       ((*(long *)(local_1f8 +
                                  (*(long *)(local_1f0 + (long)in_stack_fffffffffffff970 * 8) +
                                  local_670) * 8) - local_260) + 1);
                  lVar12 = (long)in_stack_fffffffffffff978 * local_1c8 + in_stack_fffffffffffff980;
                  *(float *)(local_170 + lVar12 * 4) =
                       *(float *)((long)__ptr +
                                 (in_stack_fffffffffffff980 +
                                 (long)in_stack_fffffffffffff970 * (long)in_stack_fffffffffffff968)
                                 * 4) *
                       *(float *)(local_278 +
                                 (*(long *)(local_1f0 + (long)in_stack_fffffffffffff970 * 8) +
                                 local_670) * 4) + *(float *)(local_170 + lVar12 * 4);
                }
              }
              else {
                for (local_670 = 0; local_670 < lVar11; local_670 = local_670 + 1) {
                  in_stack_fffffffffffff978 =
                       (Integer *)
                       ((*(long *)(local_1f8 +
                                  (*(long *)(local_1f0 + (long)in_stack_fffffffffffff970 * 8) +
                                  local_670) * 8) - local_260) + 1);
                  pIVar15 = (Integer *)
                            ((long)in_stack_fffffffffffff978 + in_stack_fffffffffffff980 * local_1c8
                            );
                  *(float *)(local_170 + (long)pIVar15 * 4) =
                       *(float *)((long)__ptr +
                                 (long)(in_stack_fffffffffffff980 * (long)in_stack_fffffffffffff968
                                       + (long)in_stack_fffffffffffff970) * 4) *
                       *(float *)(local_278 +
                                 (*(long *)(local_1f0 + (long)in_stack_fffffffffffff970 * 8) +
                                 local_670) * 4) + *(float *)(local_170 + (long)pIVar15 * 4);
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3ec) {
          if (local_20 == 0) {
            local_6f0 = local_238;
            local_6f8 = local_248;
          }
          else {
            local_6f0 = local_230;
            local_6f8 = local_240;
          }
          local_6e8 = (local_248 - (long)local_238) + 1;
          for (pIVar15 = local_6f0; (long)pIVar15 <= local_6f8;
              pIVar15 = (Integer *)((long)pIVar15 + 1)) {
            lVar11 = (long)pIVar15 - (long)local_6f0;
            for (local_6c8 = local_250; (long)local_6c8 <= local_258;
                local_6c8 = (Integer *)((long)local_6c8 + 1)) {
              lVar12 = (long)local_6c8 - (long)local_250;
              lVar13 = *(long *)(local_1f0 + 8 + lVar12 * 8) - *(long *)(local_1f0 + lVar12 * 8);
              if (local_20 == 0) {
                for (local_6c0 = 0; local_6c0 < lVar13; local_6c0 = local_6c0 + 1) {
                  lVar14 = ((*(long *)(local_1f8 +
                                      (*(long *)(local_1f0 + lVar12 * 8) + local_6c0) * 8) -
                            local_260) + 1) * local_1c8 + lVar11;
                  *(double *)(local_170 + lVar14 * 8) =
                       *(double *)((long)__ptr + (lVar11 + lVar12 * local_6e8) * 8) *
                       *(double *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_6c0) * 8)
                       + *(double *)(local_170 + lVar14 * 8);
                }
              }
              else {
                for (local_6c0 = 0; local_6c0 < lVar13; local_6c0 = local_6c0 + 1) {
                  lVar14 = (*(long *)(local_1f8 +
                                     (*(long *)(local_1f0 + lVar12 * 8) + local_6c0) * 8) -
                           local_260) + 1 + lVar11 * local_1c8;
                  *(double *)(local_170 + lVar14 * 8) =
                       *(double *)((long)__ptr + (lVar11 * local_6e8 + lVar12) * 8) *
                       *(double *)(local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_6c0) * 8)
                       + *(double *)(local_170 + lVar14 * 8);
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3ee) {
          if (local_20 == 0) {
            local_748 = local_248;
            in_stack_fffffffffffff8c0 = local_238;
          }
          else {
            local_748 = local_240;
            in_stack_fffffffffffff8c0 = local_230;
          }
          in_stack_fffffffffffff8c8 = (Integer *)((local_248 - (long)local_238) + 1);
          for (local_708 = in_stack_fffffffffffff8c0; (long)local_708 <= local_748;
              local_708 = (Integer *)((long)local_708 + 1)) {
            lVar11 = (long)local_708 - (long)in_stack_fffffffffffff8c0;
            for (local_718 = local_250; (long)local_718 <= local_258;
                local_718 = (Integer *)((long)local_718 + 1)) {
              in_stack_fffffffffffff8d0 = (Integer *)((long)local_718 - (long)local_250);
              lVar12 = *(long *)(local_1f0 + 8 + (long)in_stack_fffffffffffff8d0 * 8) -
                       *(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8);
              if (local_20 == 0) {
                for (local_710 = 0; local_710 < lVar12; local_710 = local_710 + 1) {
                  in_stack_fffffffffffff8d8 =
                       (Integer *)
                       ((*(long *)(local_1f8 +
                                  (*(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8) +
                                  local_710) * 8) - local_260) + 1);
                  in_stack_fffffffffffff894 =
                       *(float *)((long)__ptr +
                                 (lVar11 + (long)in_stack_fffffffffffff8d0 *
                                           (long)in_stack_fffffffffffff8c8) * 8);
                  in_stack_fffffffffffff890 =
                       *(float *)((long)__ptr +
                                 lVar11 * (long)in_stack_fffffffffffff8d0 *
                                 (long)in_stack_fffffffffffff8c8 * 8 + 4);
                  in_stack_fffffffffffff88c =
                       *(float *)(local_278 +
                                 (*(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8) +
                                 local_710) * 8);
                  in_stack_fffffffffffff888 =
                       *(float *)(local_278 + 4 +
                                 (*(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8) +
                                 local_710) * 8);
                  lVar13 = (long)in_stack_fffffffffffff8d8 * local_1c8 + lVar11;
                  *(float *)(local_170 + lVar13 * 8) =
                       in_stack_fffffffffffff894 * in_stack_fffffffffffff88c +
                       -(in_stack_fffffffffffff890 * in_stack_fffffffffffff888) +
                       *(float *)(local_170 + lVar13 * 8);
                  lVar13 = (long)in_stack_fffffffffffff8d8 * local_1c8 + lVar11;
                  *(float *)(local_170 + 4 + lVar13 * 8) =
                       in_stack_fffffffffffff890 * in_stack_fffffffffffff88c +
                       in_stack_fffffffffffff894 * in_stack_fffffffffffff888 +
                       *(float *)(local_170 + 4 + lVar13 * 8);
                }
              }
              else {
                for (local_710 = 0; local_710 < lVar12; local_710 = local_710 + 1) {
                  in_stack_fffffffffffff8d8 =
                       (Integer *)
                       ((*(long *)(local_1f8 +
                                  (*(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8) +
                                  local_710) * 8) - local_260) + 1);
                  in_stack_fffffffffffff8ac =
                       *(float *)((long)__ptr +
                                 (long)(lVar11 * (long)in_stack_fffffffffffff8c8 +
                                       (long)in_stack_fffffffffffff8d0) * 8);
                  in_stack_fffffffffffff8a8 =
                       *(float *)((long)__ptr +
                                 (long)(lVar11 * (long)in_stack_fffffffffffff8c8 +
                                       (long)in_stack_fffffffffffff8d0) * 8 + 4);
                  in_stack_fffffffffffff8a4 =
                       *(float *)(local_278 +
                                 (*(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8) +
                                 local_710) * 8);
                  in_stack_fffffffffffff8a0 =
                       *(float *)(local_278 + 4 +
                                 (*(long *)(local_1f0 + (long)in_stack_fffffffffffff8d0 * 8) +
                                 local_710) * 8);
                  pIVar15 = (Integer *)((long)in_stack_fffffffffffff8d8 + lVar11 * local_1c8);
                  *(float *)(local_170 + (long)pIVar15 * 8) =
                       in_stack_fffffffffffff8ac * in_stack_fffffffffffff8a4 +
                       -(in_stack_fffffffffffff8a8 * in_stack_fffffffffffff8a0) +
                       *(float *)(local_170 + (long)pIVar15 * 8);
                  pIVar15 = (Integer *)((long)in_stack_fffffffffffff8d8 + lVar11 * local_1c8);
                  *(float *)(local_170 + 4 + (long)pIVar15 * 8) =
                       in_stack_fffffffffffff8a8 * in_stack_fffffffffffff8a4 +
                       in_stack_fffffffffffff8ac * in_stack_fffffffffffff8a0 +
                       *(float *)(local_170 + 4 + (long)pIVar15 * 8);
                }
              }
            }
          }
        }
        else if (local_c0 == 0x3ef) {
          if (local_20 == 0) {
            local_7c0 = local_238;
            local_7c8 = local_248;
          }
          else {
            local_7c0 = local_230;
            local_7c8 = local_240;
          }
          local_7b8 = (local_248 - (long)local_238) + 1;
          for (local_788 = local_7c0; (long)local_788 <= local_7c8;
              local_788 = (Integer *)((long)local_788 + 1)) {
            lVar11 = (long)local_788 - (long)local_7c0;
            for (local_798 = local_250; (long)local_798 <= local_258;
                local_798 = (Integer *)((long)local_798 + 1)) {
              lVar12 = (long)local_798 - (long)local_250;
              lVar13 = *(long *)(local_1f0 + 8 + lVar12 * 8) - *(long *)(local_1f0 + lVar12 * 8);
              if (local_20 == 0) {
                for (local_790 = 0; local_790 < lVar13; local_790 = local_790 + 1) {
                  lVar14 = (*(long *)(local_1f8 +
                                     (*(long *)(local_1f0 + lVar12 * 8) + local_790) * 8) -
                           local_260) + 1;
                  dVar5 = *(double *)((long)__ptr + (lVar11 + lVar12 * local_7b8) * 0x10);
                  dVar6 = *(double *)((long)__ptr + lVar11 * lVar12 * local_7b8 * 0x10 + 8);
                  dVar7 = *(double *)
                           (local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_790) * 0x10);
                  in_stack_fffffffffffff7e0 =
                       *(double *)
                        (local_278 + 8 + (*(long *)(local_1f0 + lVar12 * 8) + local_790) * 0x10);
                  lVar16 = lVar14 * local_1c8 + lVar11;
                  *(double *)(local_170 + lVar16 * 0x10) =
                       dVar5 * dVar7 + -(dVar6 * in_stack_fffffffffffff7e0) +
                       *(double *)(local_170 + lVar16 * 0x10);
                  lVar14 = lVar14 * local_1c8 + lVar11;
                  *(double *)(local_170 + 8 + lVar14 * 0x10) =
                       dVar6 * dVar7 + dVar5 * in_stack_fffffffffffff7e0 +
                       *(double *)(local_170 + 8 + lVar14 * 0x10);
                }
              }
              else {
                for (local_790 = 0; local_790 < lVar13; local_790 = local_790 + 1) {
                  lVar14 = (*(long *)(local_1f8 +
                                     (*(long *)(local_1f0 + lVar12 * 8) + local_790) * 8) -
                           local_260) + 1;
                  dVar5 = *(double *)((long)__ptr + (lVar11 * local_7b8 + lVar12) * 0x10);
                  dVar6 = *(double *)((long)__ptr + (lVar11 * local_7b8 + lVar12) * 0x10 + 8);
                  dVar7 = *(double *)
                           (local_278 + (*(long *)(local_1f0 + lVar12 * 8) + local_790) * 0x10);
                  dVar8 = *(double *)
                           (local_278 + 8 + (*(long *)(local_1f0 + lVar12 * 8) + local_790) * 0x10);
                  lVar16 = lVar14 + lVar11 * local_1c8;
                  *(double *)(local_170 + lVar16 * 0x10) =
                       dVar5 * dVar7 + -(dVar6 * dVar8) + *(double *)(local_170 + lVar16 * 0x10);
                  lVar14 = lVar14 + lVar11 * local_1c8;
                  *(double *)(local_170 + 8 + lVar14 * 0x10) =
                       dVar6 * dVar7 + dVar5 * dVar8 + *(double *)(local_170 + 8 + lVar14 * 0x10);
                }
              }
            }
          }
        }
        free(__ptr);
      }
    }
  }
  if (local_50 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffff7b0);
  }
  return local_128;
}

Assistant:

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a, Integer s_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = g_a+GA_OFFSET;
  Integer hdl_b = s_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_b].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_b].grp);
  Integer longidx;
  Integer type;
  Integer ihi, ilo, jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_b].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (GA[hdl_a].type != SPA[hdl_b].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_b].type;
  if (GA[hdl_a].p_handle != SPA[hdl_b].grp) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_a].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be"
    " of dimension 2",GA[hdl_a].ndim);
  }
  if ((trans && GA[hdl_a].dims[0] != SPA[hdl_b].jdim) ||
      (!trans && GA[hdl_a].dims[1] != SPA[hdl_b].jdim)) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_b].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_b].size;
  if (trans) {
    idim = GA[hdl_a].dims[1];
  } else {
    idim = GA[hdl_a].dims[0];
  }
  jdim = SPA[hdl_b].jdim;
  /* Construct product array C*/
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  /* Create a partition for dense C matrix */
  ilo = (idim*me)/nprocs;
  while ((ilo*nprocs)/idim < me) {
    ilo++;
  }
  while ((ilo*nprocs)/idim > me) {
    ilo--;
  }
  if ((ilo*nprocs)/idim != me) {
    ilo++;
  }
  ilo++;
  if (me < nprocs-1) {
    ihi = (idim*(me+1))/nprocs;
    while ((ihi*nprocs)/idim < me+1) {
      ihi++;
    }
    while ((ihi*nprocs)/idim > me+1) {
      ihi--;
    }
    ihi--;
  } else {
    ihi = idim-1;
  }
  ihi++;

  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = ihi-ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_b].grp);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b, *iptr, *jptr;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = ilo;
    hi_c[0] = ihi;
    pnga_sprs_array_row_distribution(s_b,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over all sub-blocks in row block of A and column block of B
     * that contribute to target block */
    for (n=0; n<nprocs; n++) {
      void *iptr_b, *jptr_b;
      Integer lo_a[2], hi_a[2], ld_a[2];
      Integer tlo_a[2], thi_a[2];
      Integer ilo_b, ihi_b, jlo_b, jhi_b;
      void *buf_a;
      void *val_b;
      Integer nelem;
      Integer ii,jlen;
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Get block of B for multiplication */
      if (!pnga_sprs_array_get_block(s_b,n,l,&iptr_b,&jptr_b,&val_b,
            &ilo_b,&ihi_b,&jlo_b,&jhi_b)) continue;
      /* get pointers to dense blocks on A and C */
      lo_a[0] = lo_c[0];
      hi_a[0] = hi_c[0];
      lo_a[1] = ilo_b;
      hi_a[1] = ihi_b;
      if (trans) {
        tlo_a[0] = lo_a[1];
        thi_a[0] = hi_a[1];
        tlo_a[1] = lo_a[0];
        thi_a[1] = hi_a[0];
      } else {
        tlo_a[0] = lo_a[0];
        thi_a[0] = hi_a[0];
        tlo_a[1] = lo_a[1];
        thi_a[1] = hi_a[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_a[0]-tlo_a[0]+1)*(thi_a[1]-tlo_a[1]+1);
      buf_a = malloc(nelem*SPA[hdl_b].size);
      ld_a[0] = (thi_a[0]-tlo_a[0]+1);
      ld_a[1] = (thi_a[1]-tlo_a[1]+1);
      pnga_get(g_a,tlo_a,thi_a,buf_a,ld_a);
      if (SPA[hdl_b].idx_size == 4) {
        int *idx_b = (int*)iptr_b;
        int *jdx_b = (int*)jptr_b;
        data_b = val_b;

        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,
              jlo_b,jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_b = (int64_t*)iptr_b;
        int64_t *jdx_b = (int64_t*)jptr_b;
        data_b = val_b;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      }
      free(buf_a);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_b].grp);
  return g_c;
}